

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

ExprNode * parse_expr(ParserState *ps)

{
  Token TVar1;
  size_t sVar2;
  ExprNode *pEVar3;
  ExprNode *en;
  ExprNode **ppEVar4;
  char *errtext;
  ptrlen pVar5;
  size_t subexprs_size;
  
  pEVar3 = parse_atom(ps);
  if (pEVar3 == (ExprNode *)0x0) {
    pEVar3 = (ExprNode *)0x0;
  }
  else {
    TVar1 = ps->tok;
    if ((TVar1 & ~TOK_RPAR) == TOK_AND) {
      en = exprnode_new((uint)(TVar1 != TOK_AND),pEVar3->text);
      subexprs_size = 0;
      ppEVar4 = (ExprNode **)
                safegrowarray((en->field_2).field_0.subexprs,&subexprs_size,8,
                              (en->field_2).field_0.nsubexprs,1,false);
      (en->field_2).field_0.subexprs = ppEVar4;
      sVar2 = (en->field_2).field_0.nsubexprs;
      (en->field_2).field_0.nsubexprs = sVar2 + 1;
      ppEVar4[sVar2] = pEVar3;
      do {
        advance(ps);
        pEVar3 = parse_atom(ps);
        if (pEVar3 == (ExprNode *)0x0) goto LAB_00162be6;
        ppEVar4 = (ExprNode **)
                  safegrowarray((en->field_2).field_0.subexprs,&subexprs_size,8,
                                (en->field_2).field_0.nsubexprs,1,false);
        (en->field_2).field_0.subexprs = ppEVar4;
        sVar2 = (en->field_2).field_0.nsubexprs;
        (en->field_2).field_0.nsubexprs = sVar2 + 1;
        ppEVar4[sVar2] = pEVar3;
        pVar5 = make_ptrlen_startend
                          ((en->text).ptr,(void *)((long)(pEVar3->text).ptr + (pEVar3->text).len));
        en->text = pVar5;
        if ((ps->tok & ~TOK_RPAR) != TOK_AND) {
          return en;
        }
      } while (ps->tok == TVar1);
      errtext = dupstr("expected parentheses to disambiguate && and || on either side of expression"
                      );
      error(ps,errtext,pEVar3->text);
LAB_00162be6:
      exprnode_free(en);
      pEVar3 = (ExprNode *)0x0;
    }
  }
  return pEVar3;
}

Assistant:

static ExprNode *parse_expr(ParserState *ps)
{
    ExprNode *subexpr = parse_atom(ps);
    if (!subexpr)
        return NULL;

    if (ps->tok != TOK_AND && ps->tok != TOK_OR)
        return subexpr;

    Token operator = ps->tok;
    ExprNode *en = exprnode_new(ps->tok == TOK_AND ? OP_AND : OP_OR,
                                subexpr->text);
    size_t subexprs_size = 0;

    sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
    en->subexprs[en->nsubexprs++] = subexpr;

    while (true) {
        advance(ps);                   /* eat the operator */

        subexpr = parse_atom(ps);
        if (!subexpr) {
            exprnode_free(en);
            return NULL;
        }
        sgrowarray(en->subexprs, subexprs_size, en->nsubexprs);
        en->subexprs[en->nsubexprs++] = subexpr;
        en->text = make_ptrlen_startend(
            en->text.ptr, ptrlen_end(subexpr->text));

        if (ps->tok != TOK_AND && ps->tok != TOK_OR)
            return en;

        if (ps->tok != operator) {
            error(ps, dupstr("expected parentheses to disambiguate && and || "
                             "on either side of expression"), subexpr->text);
            exprnode_free(en);
            return NULL;
        }
    }
}